

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

string __thiscall mjs::to_string(mjs *this,gc_heap *h,value *v)

{
  gc_heap *this_00;
  wostream *pwVar1;
  char *pcVar2;
  value *extraout_RDX;
  value *extraout_RDX_00;
  value *extraout_RDX_01;
  string sVar3;
  wostringstream _woss;
  wstring_view local_1a8;
  value local_198 [9];
  
  switch(v->type_) {
  case undefined:
    local_198[0]._0_8_ = 9;
    local_198[0].field_1._0_8_ = "undefined";
    break;
  case null:
    local_198[0]._0_8_ = 4;
    local_198[0].field_1._0_8_ = "null";
    break;
  case boolean:
    local_198[0].field_1._0_8_ = "false";
    if ((ulong)(v->field_1).b_ != 0) {
      local_198[0].field_1._0_8_ = "true";
    }
    local_198[0]._0_8_ = (ulong)(v->field_1).b_ ^ 5;
    break;
  case number:
    sVar3 = to_string(this,h,(v->field_1).n_);
    v = sVar3.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_;
    goto LAB_00167dbe;
  case string:
    this_00 = (v->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_;
    *(gc_heap **)this = this_00;
    *(undefined4 *)(this + 8) = *(undefined4 *)((long)&v->field_1 + 8);
    if (this_00 != (gc_heap *)0x0) {
      gc_heap::attach(this_00,(gc_heap_ptr_untyped *)this);
      v = extraout_RDX;
    }
    goto LAB_00167dbe;
  case object:
    to_primitive(local_198,v,string);
    to_string(this,h,local_198);
    value::destroy(local_198);
    v = extraout_RDX_01;
    goto LAB_00167dbe;
  default:
    std::__cxx11::wostringstream::wostringstream((wostringstream *)local_198);
    pwVar1 = std::operator<<((wostream *)local_198,"Not implemented: ");
    pcVar2 = string_value(v->type_);
    std::operator<<(pwVar1,pcVar2);
    std::__cxx11::wstringbuf::str();
    throw_runtime_error(&local_1a8,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.cpp"
                        ,0xe6);
  }
  string::string((string *)this,h,(string_view *)local_198);
  v = extraout_RDX_00;
LAB_00167dbe:
  sVar3.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = v;
  sVar3.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar3.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

string to_string(gc_heap& h, const value& v) {
    switch (v.type()) {
    case value_type::undefined: return string{h, "undefined"};
    case value_type::null:      return string{h, "null"};
    case value_type::boolean:   return string{h, v.boolean_value() ? "true" : "false"};
    case value_type::number:    return to_string(h, v.number_value());
    case value_type::string:    return v.string_value();
    case value_type::object:    return to_string(h, to_primitive(v, value_type::string));
    case value_type::reference: break;
    }
    NOT_IMPLEMENTED(v.type());
}